

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationPublishBoolean(HelicsPublication pub,HelicsBool val,HelicsError *err)

{
  PublicationObject *pPVar1;
  
  pPVar1 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    helics::Publication::publish(pPVar1->pubPtr,val != 0);
  }
  return;
}

Assistant:

void helicsPublicationPublishBoolean(HelicsPublication pub, HelicsBool val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish((val != HELICS_FALSE));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}